

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

int blake2b(void *out,size_t outlen,void *in,size_t inlen,void *key,size_t keylen)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  ulong in_R9;
  int ret;
  blake2b_state S;
  int local_124;
  size_t in_stack_fffffffffffffee8;
  void *in_stack_fffffffffffffef0;
  blake2b_state *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff10;
  blake2b_state *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff28;
  void *in_stack_ffffffffffffff30;
  blake2b_state *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  blake2b_state *in_stack_ffffffffffffffa8;
  
  local_124 = -1;
  if ((((((in_RDX != 0) || (in_RCX == 0)) && (in_RDI != 0)) && ((in_RSI != 0 && (in_RSI < 0x41))))
      && ((in_R8 != 0 || (in_R9 == 0)))) && (in_R9 < 0x41)) {
    if (in_R9 == 0) {
      iVar1 = blake2b_init(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    }
    else {
      iVar1 = blake2b_init_key(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    if ((-1 < iVar1) &&
       (iVar1 = blake2b_update(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                               in_stack_fffffffffffffee8), -1 < iVar1)) {
      local_124 = blake2b_final(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                in_stack_ffffffffffffff28);
    }
  }
  return local_124;
}

Assistant:

int blake2b(void *out, size_t outlen, const void *in, size_t inlen,
	const void *key, size_t keylen) {
	blake2b_state S;
	int ret = -1;

	/* Verify parameters */
	if (NULL == in && inlen > 0) {
		goto fail;
	}

	if (NULL == out || outlen == 0 || outlen > BLAKE2B_OUTBYTES) {
		goto fail;
	}

	if ((NULL == key && keylen > 0) || keylen > BLAKE2B_KEYBYTES) {
		goto fail;
	}

	if (keylen > 0) {
		if (blake2b_init_key(&S, outlen, key, keylen) < 0) {
			goto fail;
		}
	}
	else {
		if (blake2b_init(&S, outlen) < 0) {
			goto fail;
		}
	}

	if (blake2b_update(&S, in, inlen) < 0) {
		goto fail;
	}
	ret = blake2b_final(&S, out, outlen);

fail:
	//clear_internal_memory(&S, sizeof(S));
	return ret;
}